

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peerinfo.c
# Opt level: O0

_Bool so_peercred(int fd,int *pid,int *uid,int *gid)

{
  int iVar1;
  socklen_t local_38;
  int local_34;
  socklen_t crlen;
  ucred cr;
  int *gid_local;
  int *uid_local;
  int *pid_local;
  int fd_local;
  
  local_38 = 0xc;
  cr._4_8_ = gid;
  iVar1 = getsockopt(fd,1,0x11,&local_34,&local_38);
  if (iVar1 == 0) {
    *pid = local_34;
    *uid = crlen;
    *(pid_t *)cr._4_8_ = cr.pid;
  }
  return iVar1 == 0;
}

Assistant:

bool so_peercred(int fd, int *pid, int *uid, int *gid)
{
#if HAVE_SO_PEERCRED
    struct ucred cr;
    socklen_t crlen = sizeof(cr);
    if (getsockopt(fd, SOL_SOCKET, SO_PEERCRED, &cr, &crlen) == 0) {
        *pid = cr.pid;
        *uid = cr.uid;
        *gid = cr.gid;
        return true;
    }
#endif
    return false;
}